

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  uchar *in_stack_00000008;
  uchar *in_stack_00000010;
  int *in_stack_00000018;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_ffffffffffffff68;
  secp256k1_callback *in_stack_ffffffffffffff70;
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  long local_28;
  long local_20;
  secp256k1_ecdsa_signature *local_18;
  int local_4;
  
  if (in_RDI == (secp256k1_ecmult_gen_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/secp256k1.c"
            ,0x239,"test condition failed: ctx != NULL");
    abort();
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else if (local_20 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else if (local_18 == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else if (local_28 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_sign_inner
                      ((secp256k1_context *)s.d[2],(secp256k1_scalar *)s.d[1],
                       (secp256k1_scalar *)s.d[0],in_stack_00000018,in_stack_00000010,
                       in_stack_00000008,(secp256k1_nonce_function)r.d[0],(void *)r.d[1]);
    secp256k1_ecdsa_signature_save(local_18,&local_58,&local_78);
    local_4 = iVar1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}